

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

ostream * lest::operator<<(ostream *os,comment *note)

{
  size_type sVar1;
  ostream *poVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  char *local_60;
  long local_58;
  char local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  long local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  sVar1 = (note->info)._M_string_length;
  if (sVar1 == 0) {
    local_40 = &local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_40,local_40->_M_local_buf + local_38);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
  }
  else {
    std::operator+(&local_80," ",&note->info);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,local_60,local_58);
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  paVar3 = &local_80.field_2;
  if (sVar1 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar3) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    paVar3 = &local_30;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar3->_M_local_buf + -0x10) != paVar3) {
    operator_delete(*(undefined1 **)(paVar3->_M_local_buf + -0x10));
  }
  return poVar2;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, comment note )
{
    return os << (note ? " " + note.info : "" );
}